

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O0

void warning(char *s,...)

{
  char local_238 [8];
  char pbuf [256];
  va_list the_args;
  char local_118 [8];
  char str [256];
  char *s_local;
  
  pbuf[0xfc] = '0';
  pbuf[0xfd] = '\0';
  pbuf[0xfe] = '\0';
  pbuf[0xff] = '\0';
  pbuf[0xf8] = '\b';
  pbuf[0xf9] = '\0';
  pbuf[0xfa] = '\0';
  pbuf[0xfb] = '\0';
  vsprintf(local_238,s,pbuf + 0xf8);
  paniclog("warning",local_238);
  vsprintf(local_118,s,pbuf + 0xf8);
  pline("Warning: %s\n",local_118);
  return;
}

Assistant:

void warning(const char *s, ...)
{
	char str[BUFSZ];
	va_list the_args;
	va_start(the_args, s);
	{
	    char pbuf[BUFSZ];
	    vsprintf(pbuf, s, the_args);
	    paniclog("warning", pbuf);
	}
	vsprintf(str, s, the_args);
	pline("Warning: %s\n", str);
	va_end(the_args);
}